

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void compaction_daemon_test(size_t time_sec)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  fdb_file_info *kvs_config_00;
  void *__s2;
  char *pcVar5;
  long lVar6;
  fdb_doc *unaff_RBP;
  fdb_doc *pfVar7;
  fdb_file_info *info_00;
  char *pcVar8;
  fdb_kvs_handle *pfVar9;
  undefined1 handle [8];
  uint uVar10;
  fdb_kvs_handle *unaff_R12;
  ulong uVar11;
  char *unaff_R13;
  fdb_config *pfVar12;
  ulong uVar13;
  __atomic_base<unsigned_long> unaff_R15;
  timeval tVar14;
  timeval tVar15;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_manual;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile_non;
  fdb_file_handle *dbfile_less;
  fdb_kvs_config kvs_config;
  fdb_kvs_handle *snapshot;
  fdb_kvs_handle *db_manual;
  fdb_kvs_handle *db_non;
  fdb_kvs_handle *db_less;
  fdb_file_handle *dbfile_new;
  timeval ts_cur;
  fdb_config fconfig;
  timeval ts_begin;
  timeval __test_begin;
  fdb_file_info info;
  char keybuf [256];
  char metabuf [256];
  char bodybuf [256];
  fdb_kvs_handle *pfStack_14318;
  undefined1 auStack_14310 [16];
  undefined1 auStack_14300 [8];
  undefined1 auStack_142f8 [80];
  ulong uStack_142a8;
  timeval tStack_14288;
  fdb_file_info afStack_14278 [3];
  fdb_file_info afStack_14178 [3];
  fdb_config fStack_14078;
  fdb_kvs_handle *pfStack_13f80;
  fdb_kvs_handle *pfStack_13f78;
  char *pcStack_13f70;
  fdb_config *pfStack_13f68;
  char *pcStack_13f60;
  fdb_doc *pfStack_13f58;
  fdb_file_handle *pfStack_13f48;
  fdb_kvs_handle *pfStack_13f40;
  timeval tStack_13f38;
  char acStack_13f27 [15];
  timeval tStack_13f18;
  timeval tStack_13f08;
  undefined1 auStack_13ef8 [70];
  undefined1 uStack_13eb2;
  undefined8 uStack_13ea8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_13de8;
  fdb_kvs_handle *pfStack_13de0;
  char *pcStack_13dd8;
  fdb_kvs_handle *pfStack_13dd0;
  char *pcStack_13dc8;
  fdb_doc *pfStack_13dc0;
  undefined1 auStack_13da8 [16];
  fdb_kvs_handle *pfStack_13d98;
  fdb_doc *pfStack_13d90;
  fdb_kvs_handle *pfStack_13d88;
  fdb_kvs_handle *pfStack_13d80;
  hbtrie *phStack_13d78;
  fdb_kvs_config fStack_13d70;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_13d58;
  filemgr *pfStack_13d50;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_13d48;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_13d40;
  filemgr *pfStack_13d38;
  fdb_kvs_handle *pfStack_13d30;
  timeval tStack_13d28;
  undefined1 auStack_13d18 [256];
  __atomic_base<unsigned_long> _Stack_13c18;
  timeval tStack_13c10;
  __atomic_base<unsigned_long> _Stack_13c00;
  char acStack_13bb8 [256];
  char acStack_13ab8 [256];
  char acStack_139b8 [256];
  fdb_doc afStack_138b8 [1000];
  undefined8 uStack_38;
  
  pcVar5 = (char *)0x0;
  pfStack_13dc0 = (fdb_doc *)0x10fcab;
  phStack_13d78 = (hbtrie *)time_sec;
  gettimeofday(&tStack_13c10,(__timezone_ptr_t)0x0);
  pfStack_13dc0 = (fdb_doc *)0x10fcb0;
  memleak_start();
  pfStack_13dc0 = (fdb_doc *)0x10fcbc;
  system("rm -rf  compact_test* > errorlog.txt");
  pfVar9 = (fdb_kvs_handle *)auStack_13d18;
  pfStack_13dc0 = (fdb_doc *)0x10fccc;
  fdb_get_default_config();
  pfStack_13dc0 = (fdb_doc *)0x10fcd6;
  fdb_get_default_kvs_config();
  auStack_13d18._8_8_ = (kvs_ops_stat *)0x0;
  auStack_13d18._16_8_ = (fdb_file_handle *)0x400;
  auStack_13d18._36_4_ = 1;
  auStack_13d18._46_2_ = 0x1e01;
  auStack_13d18._56_8_ = (docio_handle *)0x1;
  auStack_13d18._120_8_ = 0;
  pcVar8 = auStack_13da8;
  pfStack_13dc0 = (fdb_doc *)0x10fd11;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test",(fdb_config *)pfVar9);
  if (fVar1 != FDB_RESULT_INVALID_CONFIG) goto LAB_0011080b;
  auStack_13d18._120_8_ = 4;
  pfStack_13dc0 = (fdb_doc *)0x10fd3e;
  fdb_open((fdb_file_handle **)auStack_13da8,"compact_test",(fdb_config *)auStack_13d18);
  pfVar9 = (fdb_kvs_handle *)(auStack_13da8 + 8);
  pfStack_13dc0 = (fdb_doc *)0x10fd53;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_13da8._0_8_,(fdb_kvs_handle **)pfVar9,&fStack_13d70);
  pfStack_13dc0 = (fdb_doc *)0x10fd69;
  pcVar8 = (char *)auStack_13da8._8_8_;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_13da8._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110810;
  pfStack_13dc0 = (fdb_doc *)0x10fd7d;
  puts("Initialize..");
  pcVar5 = (char *)0x0;
  uVar11 = 0;
  do {
    pfStack_13dc0 = (fdb_doc *)0x10fd9e;
    sprintf(acStack_13bb8,"key%04d",uVar11 & 0xffffffff);
    pfStack_13dc0 = (fdb_doc *)0x10fdba;
    sprintf(acStack_13ab8,"meta%04d",uVar11 & 0xffffffff);
    pfStack_13dc0 = (fdb_doc *)0x10fdd6;
    sprintf(acStack_139b8,"body%04d",uVar11 & 0xffffffff);
    unaff_RBP = (fdb_doc *)((long)&afStack_138b8[0].keylen + (long)pcVar5);
    pfStack_13dc0 = (fdb_doc *)0x10fde9;
    sVar3 = strlen(acStack_13bb8);
    unaff_R15._M_i = sVar3 + 1;
    pfStack_13dc0 = (fdb_doc *)0x10fdf5;
    sVar3 = strlen(acStack_13ab8);
    unaff_R13 = (char *)(sVar3 + 1);
    pfStack_13dc0 = (fdb_doc *)0x10fe01;
    sVar3 = strlen(acStack_139b8);
    pfStack_13dc0 = (fdb_doc *)0x10fe29;
    fdb_doc_create((fdb_doc **)unaff_RBP,acStack_13bb8,unaff_R15._M_i,acStack_13ab8,
                   (size_t)unaff_R13,acStack_139b8,sVar3 + 1);
    pfStack_13dc0 = (fdb_doc *)0x10fe3b;
    fdb_set((fdb_kvs_handle *)auStack_13da8._8_8_,(fdb_doc *)(&afStack_138b8[0].keylen)[uVar11]);
    uVar11 = uVar11 + 1;
    pcVar5 = (char *)((long)pcVar5 + 8);
  } while (uVar11 != 10000);
  pfVar9 = (fdb_kvs_handle *)auStack_13da8;
  pfStack_13dc0 = (fdb_doc *)0x10fe5e;
  fdb_commit((fdb_file_handle *)auStack_13da8._0_8_,'\0');
  pfStack_13dc0 = (fdb_doc *)0x10fe66;
  fdb_close((fdb_file_handle *)auStack_13da8._0_8_);
  pfStack_13dc0 = (fdb_doc *)0x10fe7d;
  pcVar8 = (char *)pfVar9;
  fVar1 = fdb_open((fdb_file_handle **)pfVar9,"compact_test",(fdb_config *)auStack_13d18);
  unaff_R12 = (fdb_kvs_handle *)0x2710;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110815;
  pfStack_13dc0 = (fdb_doc *)0x10fe99;
  pcVar8 = (char *)auStack_13da8._0_8_;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_13da8._0_8_,(fdb_kvs_handle **)(auStack_13da8 + 8),
                     &fStack_13d70);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011081a;
  pfStack_13dc0 = (fdb_doc *)0x10feb9;
  pcVar8 = (char *)auStack_13da8._8_8_;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_13da8._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011081f;
  pfVar9 = (fdb_kvs_handle *)&_Stack_13c00;
  pfStack_13dc0 = (fdb_doc *)0x10fed6;
  fdb_get_file_info((fdb_file_handle *)auStack_13da8._0_8_,(fdb_file_info *)pfVar9);
  pfStack_13dc0 = (fdb_doc *)0x10fee5;
  iVar2 = strcmp((char *)_Stack_13c00._M_i,"compact_test");
  if (iVar2 != 0) {
    pfStack_13dc0 = (fdb_doc *)0x10fef6;
    compaction_daemon_test();
  }
  pcVar5 = "key%04d";
  unaff_R15._M_i = (__int_type_conflict)acStack_13bb8;
  unaff_R13 = (char *)0x0;
  pfVar7 = unaff_RBP;
  do {
    pfStack_13dc0 = (fdb_doc *)0x10ff18;
    sprintf((char *)unaff_R15._M_i,"key%04d",(ulong)unaff_R13 & 0xffffffff);
    pfStack_13dc0 = (fdb_doc *)0x10ff20;
    sVar3 = strlen((char *)unaff_R15._M_i);
    pfStack_13dc0 = (fdb_doc *)0x10ff41;
    fdb_doc_create(&pfStack_13d90,(void *)unaff_R15._M_i,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_13dc0 = (fdb_doc *)0x10ff50;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_13da8._8_8_,pfStack_13d90);
    unaff_RBP = pfStack_13d90;
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_001107e6:
      pfStack_13dc0 = (fdb_doc *)0x1107eb;
      compaction_daemon_test();
      goto LAB_001107eb;
    }
    pfVar9 = (fdb_kvs_handle *)pfStack_13d90->body;
    unaff_R12 = *(fdb_kvs_handle **)((&afStack_138b8[0].keylen)[(long)unaff_R13] + 0x40);
    pfStack_13dc0 = (fdb_doc *)0x10ff7c;
    iVar2 = bcmp(pfVar9,unaff_R12,pfStack_13d90->bodylen);
    pfVar7 = unaff_RBP;
    if (iVar2 != 0) {
      pfStack_13dc0 = (fdb_doc *)0x1107e6;
      compaction_daemon_test();
      goto LAB_001107e6;
    }
    pfStack_13dc0 = (fdb_doc *)0x10ff8c;
    fdb_doc_free(unaff_RBP);
    unaff_R13 = unaff_R13 + 1;
  } while (unaff_R13 != (char *)0x2710);
  pfStack_13dc0 = (fdb_doc *)0x10ffb0;
  pcVar8 = (char *)auStack_13da8._8_8_;
  fVar1 = fdb_snapshot_open((fdb_kvs_handle *)auStack_13da8._8_8_,(fdb_kvs_handle **)&pfStack_13d50,
                            10000);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110824;
  pfStack_13dc0 = (fdb_doc *)0x10ffc2;
  fdb_kvs_close((fdb_kvs_handle *)pfStack_13d50);
  pfVar9 = (fdb_kvs_handle *)auStack_13da8;
  pfStack_13dc0 = (fdb_doc *)0x10ffcf;
  fdb_close((fdb_file_handle *)auStack_13da8._0_8_);
  pfStack_13dc0 = (fdb_doc *)0x10ffdb;
  system("rm -rf  compact_test.meta > errorlog.txt");
  pfStack_13dc0 = (fdb_doc *)0x10fff2;
  pcVar8 = (char *)pfVar9;
  fVar1 = fdb_open((fdb_file_handle **)pfVar9,"compact_test",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110829;
  pfStack_13dc0 = (fdb_doc *)0x11000e;
  pcVar8 = (char *)auStack_13da8._0_8_;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_13da8._0_8_,(fdb_kvs_handle **)(auStack_13da8 + 8),
                     &fStack_13d70);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011082e;
  pfStack_13dc0 = (fdb_doc *)0x11002e;
  pcVar8 = (char *)auStack_13da8._8_8_;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_13da8._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110833;
  pcVar5 = "key%04d";
  unaff_R15._M_i = (__int_type_conflict)acStack_13bb8;
  unaff_R13 = (char *)0x0;
  do {
    pfStack_13dc0 = (fdb_doc *)0x110058;
    sprintf((char *)unaff_R15._M_i,"key%04d",(ulong)unaff_R13 & 0xffffffff);
    pfStack_13dc0 = (fdb_doc *)0x110060;
    sVar3 = strlen((char *)unaff_R15._M_i);
    pfStack_13dc0 = (fdb_doc *)0x110081;
    fdb_doc_create(&pfStack_13d90,(void *)unaff_R15._M_i,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_13dc0 = (fdb_doc *)0x110090;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_13da8._8_8_,pfStack_13d90);
    pfVar7 = pfStack_13d90;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001107f6;
    pfVar9 = (fdb_kvs_handle *)pfStack_13d90->body;
    unaff_R12 = *(fdb_kvs_handle **)((&afStack_138b8[0].keylen)[(long)unaff_R13] + 0x40);
    pfStack_13dc0 = (fdb_doc *)0x1100bc;
    iVar2 = bcmp(pfVar9,unaff_R12,pfStack_13d90->bodylen);
    if (iVar2 != 0) goto LAB_001107eb;
    pfStack_13dc0 = (fdb_doc *)0x1100cc;
    fdb_doc_free(pfVar7);
    unaff_R13 = unaff_R13 + 1;
    unaff_RBP = pfVar7;
  } while (unaff_R13 != (char *)0x2710);
  pfVar9 = (fdb_kvs_handle *)auStack_13da8;
  pfStack_13dc0 = (fdb_doc *)0x1100e9;
  fdb_close((fdb_file_handle *)auStack_13da8._0_8_);
  pfStack_13dc0 = (fdb_doc *)0x1100f5;
  system("mv  compact_test.0 compact_test.23 > errorlog.txt");
  pfStack_13dc0 = (fdb_doc *)0x11010c;
  pcVar8 = (char *)pfVar9;
  fVar1 = fdb_open((fdb_file_handle **)pfVar9,"compact_test",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110838;
  pfStack_13dc0 = (fdb_doc *)0x110128;
  pcVar8 = (char *)auStack_13da8._0_8_;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_13da8._0_8_,(fdb_kvs_handle **)(auStack_13da8 + 8),
                     &fStack_13d70);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011083d;
  pfStack_13dc0 = (fdb_doc *)0x110148;
  pcVar8 = (char *)auStack_13da8._8_8_;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_13da8._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110842;
  pcVar5 = "key%04d";
  unaff_R15._M_i = (__int_type_conflict)acStack_13bb8;
  unaff_R13 = (char *)0x0;
  do {
    pfStack_13dc0 = (fdb_doc *)0x110172;
    sprintf((char *)unaff_R15._M_i,"key%04d",(ulong)unaff_R13 & 0xffffffff);
    pfStack_13dc0 = (fdb_doc *)0x11017a;
    sVar3 = strlen((char *)unaff_R15._M_i);
    pfStack_13dc0 = (fdb_doc *)0x11019b;
    fdb_doc_create(&pfStack_13d90,(void *)unaff_R15._M_i,sVar3 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_13dc0 = (fdb_doc *)0x1101aa;
    pcVar8 = (char *)auStack_13da8._8_8_;
    fVar1 = fdb_get((fdb_kvs_handle *)auStack_13da8._8_8_,pfStack_13d90);
    pfVar7 = pfStack_13d90;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110806;
    pfVar9 = (fdb_kvs_handle *)pfStack_13d90->body;
    unaff_R12 = *(fdb_kvs_handle **)((&afStack_138b8[0].keylen)[(long)unaff_R13] + 0x40);
    pfStack_13dc0 = (fdb_doc *)0x1101d6;
    iVar2 = bcmp(pfVar9,unaff_R12,pfStack_13d90->bodylen);
    if (iVar2 != 0) goto LAB_001107fb;
    pfStack_13dc0 = (fdb_doc *)0x1101e6;
    fdb_doc_free(pfVar7);
    unaff_R13 = unaff_R13 + 1;
    unaff_RBP = pfVar7;
  } while (unaff_R13 != (char *)0x2710);
  pfStack_13dc0 = (fdb_doc *)0x110200;
  fdb_close((fdb_file_handle *)auStack_13da8._0_8_);
  pcVar8 = (char *)&pfStack_13d80;
  pfStack_13dc0 = (fdb_doc *)0x110219;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_less",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110847;
  pfStack_13dc0 = (fdb_doc *)0x110238;
  pcVar8 = (char *)pfStack_13d80;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_13d80,(fdb_kvs_handle **)&pfStack_13d38,
                     &fStack_13d70);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011084c;
  auStack_13d18._46_2_ = auStack_13d18._46_2_ & 0xff;
  pcVar8 = (char *)&pfStack_13d88;
  pfStack_13dc0 = (fdb_doc *)0x11025d;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_non",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110851;
  pfStack_13dc0 = (fdb_doc *)0x110279;
  pcVar8 = (char *)pfStack_13d88;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_13d88,(fdb_kvs_handle **)&aStack_13d40.seqtree,
                     &fStack_13d70);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110856;
  auStack_13d18._46_2_ = auStack_13d18._46_2_ & 0xff00;
  pcVar8 = (char *)&pfStack_13d98;
  pfStack_13dc0 = (fdb_doc *)0x11029e;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_manual",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011085b;
  pfStack_13dc0 = (fdb_doc *)0x1102ba;
  pcVar8 = (char *)pfStack_13d98;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_13d98,(fdb_kvs_handle **)&aStack_13d48.seqtree,
                     &fStack_13d70);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110860;
  auStack_13d18._46_2_ = 0x1e01;
  pcVar8 = auStack_13da8;
  pfStack_13dc0 = (fdb_doc *)0x1102e1;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110865;
  pfStack_13dc0 = (fdb_doc *)0x1102fd;
  pcVar8 = (char *)auStack_13da8._0_8_;
  fVar1 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_13da8._0_8_,(fdb_kvs_handle **)(auStack_13da8 + 8),
                     &fStack_13d70);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011086a;
  pfStack_13dc0 = (fdb_doc *)0x11031d;
  pcVar8 = (char *)auStack_13da8._8_8_;
  fVar1 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_13da8._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011086f;
  pcVar5 = (char *)0x0;
  pfStack_13dc0 = (fdb_doc *)0x11033a;
  printf("wait for %d seconds..\n");
  pfStack_13dc0 = (fdb_doc *)0x11034c;
  gettimeofday((timeval *)(auStack_13d18 + 0xf8),(__timezone_ptr_t)0x0);
  tVar15.tv_usec = _Stack_13c18._M_i;
  tVar15.tv_sec = auStack_13d18._248_8_;
  do {
    pfVar7 = (fdb_doc *)0xfffffffffffec780;
    unaff_R13 = (char *)0x0;
    iVar2 = 0;
    aStack_13d58 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar5;
    do {
      pfStack_13dc0 = (fdb_doc *)0x110388;
      fdb_set((fdb_kvs_handle *)auStack_13da8._8_8_,*(fdb_doc **)((long)&uStack_38 + (long)pfVar7));
      pfStack_13dc0 = (fdb_doc *)0x110394;
      fdb_commit((fdb_file_handle *)auStack_13da8._0_8_,'\0');
      uVar10 = (int)((ulong)unaff_R13 / 100) * 100 + iVar2;
      unaff_R12 = (fdb_kvs_handle *)(ulong)uVar10;
      if (uVar10 == 0) {
        pfStack_13dc0 = (fdb_doc *)0x1103ae;
        fdb_set((fdb_kvs_handle *)pfStack_13d38,*(fdb_doc **)((long)&uStack_38 + (long)pfVar7));
        pfStack_13dc0 = (fdb_doc *)0x1103ba;
        fdb_commit((fdb_file_handle *)pfStack_13d80,'\0');
      }
      pfStack_13dc0 = (fdb_doc *)0x1103cc;
      fdb_set((fdb_kvs_handle *)aStack_13d40.seqtree,*(fdb_doc **)((long)&uStack_38 + (long)pfVar7))
      ;
      pfStack_13dc0 = (fdb_doc *)0x1103d8;
      fdb_commit((fdb_file_handle *)pfStack_13d88,'\0');
      pfStack_13dc0 = (fdb_doc *)0x1103ea;
      fdb_set((fdb_kvs_handle *)aStack_13d48.seqtree,*(fdb_doc **)((long)&uStack_38 + (long)pfVar7))
      ;
      pfStack_13dc0 = (fdb_doc *)0x1103f6;
      fdb_commit((fdb_file_handle *)pfStack_13d98,'\0');
      pfStack_13dc0 = (fdb_doc *)0x110405;
      gettimeofday((timeval *)&tStack_13d28,(__timezone_ptr_t)0x0);
      pfStack_13dc0 = (fdb_doc *)0x110420;
      tVar14 = _utime_gap(tVar15,tStack_13d28);
      if (phStack_13d78 <= (hbtrie *)tVar14.tv_sec) {
        pcVar5 = (char *)(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
        break;
      }
      iVar2 = iVar2 + -1;
      unaff_R13 = (char *)(ulong)((int)unaff_R13 + 1);
      pfVar7 = (fdb_doc *)&pfVar7->metalen;
      pcVar5 = (char *)aStack_13d58;
    } while (pfVar7 != (fdb_doc *)0x0);
  } while ((int)pcVar5 == 0);
  pfStack_13dc0 = (fdb_doc *)0x110459;
  pcVar8 = (char *)auStack_13da8._0_8_;
  fVar1 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_13da8._0_8_,0x3c);
  pfVar9 = (fdb_kvs_handle *)auStack_13d18._248_8_;
  unaff_R15._M_i = _Stack_13c18._M_i;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110874;
  pfStack_13dc0 = (fdb_doc *)0x110470;
  pcVar8 = (char *)auStack_13da8._0_8_;
  fVar1 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_13da8._0_8_,1);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110879;
  pfStack_13dc0 = (fdb_doc *)0x110484;
  pcVar8 = (char *)pfStack_13d88;
  fVar1 = fdb_compact((fdb_file_handle *)pfStack_13d88,(char *)0x0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011087e;
  pfStack_13dc0 = (fdb_doc *)0x11049d;
  pcVar8 = (char *)pfStack_13d98;
  fVar1 = fdb_compact((fdb_file_handle *)pfStack_13d98,"compact_test_manual_compacted");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110883;
  auStack_13d18._46_2_ = auStack_13d18._46_2_ & 0xff00;
  pcVar8 = (char *)&pfStack_13d30;
  pfStack_13dc0 = (fdb_doc *)0x1104c5;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_manual_compacted",
                   (fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110888;
  pfStack_13dc0 = (fdb_doc *)0x1104e1;
  pcVar8 = (char *)pfStack_13d98;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_13d98,'\x01',0x1e);
  if (fVar1 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011088d;
  pfStack_13dc0 = (fdb_doc *)0x1104f7;
  fVar1 = fdb_close((fdb_file_handle *)pfStack_13d30);
  pcVar8 = (char *)pfStack_13d30;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110892;
  pfStack_13dc0 = (fdb_doc *)0x110513;
  pcVar8 = (char *)pfStack_13d98;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_13d98,'\x01',10);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110897;
  pfStack_13dc0 = (fdb_doc *)0x11052f;
  pcVar8 = (char *)pfStack_13d98;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_13d98,'\x01',0x1e);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011089c;
  pfStack_13dc0 = (fdb_doc *)0x110541;
  pcVar8 = (char *)pfStack_13d98;
  fVar1 = fdb_close((fdb_file_handle *)pfStack_13d98);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108a1;
  auStack_13d18[0x2e] = 1;
  pcVar8 = (char *)&pfStack_13d98;
  pfStack_13dc0 = (fdb_doc *)0x110566;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_manual_compacted",
                   (fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108a6;
  pfStack_13dc0 = (fdb_doc *)0x11057c;
  pcVar8 = (char *)pfStack_13d88;
  fVar1 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_13d88,'\0',0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108ab;
  pfStack_13dc0 = (fdb_doc *)0x11058e;
  pcVar8 = (char *)pfStack_13d88;
  fVar1 = fdb_close((fdb_file_handle *)pfStack_13d88);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108b0;
  auStack_13d18._46_2_ = auStack_13d18._46_2_ & 0xff00;
  pcVar8 = (char *)&pfStack_13d88;
  pfStack_13dc0 = (fdb_doc *)0x1105b3;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_non",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108b5;
  pcVar5 = "compact_test_non.manual";
  pfStack_13dc0 = (fdb_doc *)0x1105cf;
  fdb_compact((fdb_file_handle *)pfStack_13d88,"compact_test_non.manual");
  pfVar9 = (fdb_kvs_handle *)auStack_13da8;
  pfStack_13dc0 = (fdb_doc *)0x1105dc;
  fdb_close((fdb_file_handle *)auStack_13da8._0_8_);
  pfStack_13dc0 = (fdb_doc *)0x1105e6;
  fdb_close((fdb_file_handle *)pfStack_13d80);
  pfStack_13dc0 = (fdb_doc *)0x1105f0;
  fdb_close((fdb_file_handle *)pfStack_13d98);
  auStack_13d18[0x2e] = 1;
  pfStack_13dc0 = (fdb_doc *)0x110607;
  pcVar8 = (char *)pfVar9;
  fVar1 = fdb_open((fdb_file_handle **)pfVar9,"compact_test_non.manual",(fdb_config *)auStack_13d18)
  ;
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108ba;
  pcVar8 = "compact_test_non.manual";
  pfStack_13dc0 = (fdb_doc *)0x110624;
  fVar1 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108bf;
  auStack_13d18._46_2_ = auStack_13d18._46_2_ & 0xff00;
  pcVar8 = auStack_13da8;
  pfStack_13dc0 = (fdb_doc *)0x11064a;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_manual_compacted",
                   (fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c4;
  pcVar8 = "compact_test_manual_compacted";
  pfStack_13dc0 = (fdb_doc *)0x110667;
  fVar1 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c9;
  auStack_13d18[0x2e] = 1;
  pcVar8 = "compact_test_manual_compacted";
  pfStack_13dc0 = (fdb_doc *)0x110688;
  fVar1 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108ce;
  auStack_13d18._46_2_ = auStack_13d18._46_2_ & 0xff00;
  pcVar8 = "compact_test_non.manual";
  pfStack_13dc0 = (fdb_doc *)0x1106a8;
  fVar1 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_FILE_IS_BUSY) goto LAB_001108d3;
  pfStack_13dc0 = (fdb_doc *)0x1106bb;
  fdb_close((fdb_file_handle *)pfStack_13d88);
  pfStack_13dc0 = (fdb_doc *)0x1106c0;
  fVar1 = fdb_shutdown();
  pcVar8 = (char *)pfStack_13d88;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108d8;
  pcVar8 = "compact_test_non.manual";
  pfStack_13dc0 = (fdb_doc *)0x1106dc;
  fVar1 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001108dd;
  auStack_13d18._36_4_ = 2;
  pcVar8 = auStack_13da8;
  pfStack_13dc0 = (fdb_doc *)0x110704;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"./compact_test_manual_compacted",
                   (fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e2;
  pcVar8 = auStack_13da8;
  pfStack_13dc0 = (fdb_doc *)0x110726;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"./compact_test_manual_compacted.meta",
                   (fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e7;
  pcVar8 = auStack_13da8;
  pfStack_13dc0 = (fdb_doc *)0x110748;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_non",(fdb_config *)auStack_13d18);
  if (fVar1 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108ec;
  pcVar8 = auStack_13da8;
  pfStack_13dc0 = (fdb_doc *)0x11076a;
  fVar1 = fdb_open((fdb_file_handle **)pcVar8,"compact_test_non.manual",(fdb_config *)auStack_13d18)
  ;
  if (fVar1 == FDB_RESULT_NO_SUCH_FILE) {
    lVar6 = 0;
    do {
      pfStack_13dc0 = (fdb_doc *)0x110782;
      fdb_doc_free((fdb_doc *)(&afStack_138b8[0].keylen)[lVar6]);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 10000);
    pfStack_13dc0 = (fdb_doc *)0x110793;
    fdb_shutdown();
    pfStack_13dc0 = (fdb_doc *)0x110798;
    memleak_end();
    pcVar8 = "%s PASSED\n";
    if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
      pcVar8 = "%s FAILED\n";
    }
    pfStack_13dc0 = (fdb_doc *)0x1107c9;
    fprintf(_stderr,pcVar8,"compaction daemon test");
    return;
  }
  goto LAB_001108f1;
LAB_00110ea0:
  auto_compaction_with_custom_cmp_function();
LAB_00110ea5:
  auto_compaction_with_custom_cmp_function();
LAB_00110eaa:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110eaf;
LAB_001107eb:
  pfStack_13dc0 = (fdb_doc *)0x1107f6;
  compaction_daemon_test();
  unaff_RBP = pfVar7;
LAB_001107f6:
  pfVar7 = unaff_RBP;
  pfStack_13dc0 = (fdb_doc *)0x1107fb;
  compaction_daemon_test();
LAB_001107fb:
  pfStack_13dc0 = (fdb_doc *)0x110806;
  pcVar8 = (char *)unaff_R12;
  compaction_daemon_test();
  unaff_RBP = pfVar7;
LAB_00110806:
  unaff_R15._M_i = (__int_type_conflict)acStack_13bb8;
  pcVar5 = "key%04d";
  pfStack_13dc0 = (fdb_doc *)0x11080b;
  compaction_daemon_test();
LAB_0011080b:
  pfStack_13dc0 = (fdb_doc *)0x110810;
  compaction_daemon_test();
LAB_00110810:
  pfStack_13dc0 = (fdb_doc *)0x110815;
  compaction_daemon_test();
LAB_00110815:
  pfStack_13dc0 = (fdb_doc *)0x11081a;
  compaction_daemon_test();
LAB_0011081a:
  pfStack_13dc0 = (fdb_doc *)0x11081f;
  compaction_daemon_test();
LAB_0011081f:
  pfStack_13dc0 = (fdb_doc *)0x110824;
  compaction_daemon_test();
LAB_00110824:
  pfStack_13dc0 = (fdb_doc *)0x110829;
  compaction_daemon_test();
LAB_00110829:
  pfStack_13dc0 = (fdb_doc *)0x11082e;
  compaction_daemon_test();
LAB_0011082e:
  pfStack_13dc0 = (fdb_doc *)0x110833;
  compaction_daemon_test();
  pfVar7 = unaff_RBP;
LAB_00110833:
  pfStack_13dc0 = (fdb_doc *)0x110838;
  compaction_daemon_test();
LAB_00110838:
  pfStack_13dc0 = (fdb_doc *)0x11083d;
  compaction_daemon_test();
LAB_0011083d:
  pfStack_13dc0 = (fdb_doc *)0x110842;
  compaction_daemon_test();
LAB_00110842:
  pfStack_13dc0 = (fdb_doc *)0x110847;
  compaction_daemon_test();
LAB_00110847:
  pfStack_13dc0 = (fdb_doc *)0x11084c;
  compaction_daemon_test();
LAB_0011084c:
  pfStack_13dc0 = (fdb_doc *)0x110851;
  compaction_daemon_test();
LAB_00110851:
  pfStack_13dc0 = (fdb_doc *)0x110856;
  compaction_daemon_test();
LAB_00110856:
  pfStack_13dc0 = (fdb_doc *)0x11085b;
  compaction_daemon_test();
LAB_0011085b:
  pfStack_13dc0 = (fdb_doc *)0x110860;
  compaction_daemon_test();
LAB_00110860:
  pfStack_13dc0 = (fdb_doc *)0x110865;
  compaction_daemon_test();
LAB_00110865:
  pfStack_13dc0 = (fdb_doc *)0x11086a;
  compaction_daemon_test();
LAB_0011086a:
  pfStack_13dc0 = (fdb_doc *)0x11086f;
  compaction_daemon_test();
LAB_0011086f:
  pfStack_13dc0 = (fdb_doc *)0x110874;
  compaction_daemon_test();
LAB_00110874:
  pfStack_13dc0 = (fdb_doc *)0x110879;
  compaction_daemon_test();
LAB_00110879:
  pfStack_13dc0 = (fdb_doc *)0x11087e;
  compaction_daemon_test();
LAB_0011087e:
  pfStack_13dc0 = (fdb_doc *)0x110883;
  compaction_daemon_test();
LAB_00110883:
  pfStack_13dc0 = (fdb_doc *)0x110888;
  compaction_daemon_test();
LAB_00110888:
  pfStack_13dc0 = (fdb_doc *)0x11088d;
  compaction_daemon_test();
LAB_0011088d:
  pfStack_13dc0 = (fdb_doc *)0x110892;
  compaction_daemon_test();
LAB_00110892:
  pfStack_13dc0 = (fdb_doc *)0x110897;
  compaction_daemon_test();
LAB_00110897:
  pfStack_13dc0 = (fdb_doc *)0x11089c;
  compaction_daemon_test();
LAB_0011089c:
  pfStack_13dc0 = (fdb_doc *)0x1108a1;
  compaction_daemon_test();
LAB_001108a1:
  pfStack_13dc0 = (fdb_doc *)0x1108a6;
  compaction_daemon_test();
LAB_001108a6:
  pfStack_13dc0 = (fdb_doc *)0x1108ab;
  compaction_daemon_test();
LAB_001108ab:
  pfStack_13dc0 = (fdb_doc *)0x1108b0;
  compaction_daemon_test();
LAB_001108b0:
  pfStack_13dc0 = (fdb_doc *)0x1108b5;
  compaction_daemon_test();
LAB_001108b5:
  pfStack_13dc0 = (fdb_doc *)0x1108ba;
  compaction_daemon_test();
LAB_001108ba:
  pfStack_13dc0 = (fdb_doc *)0x1108bf;
  compaction_daemon_test();
LAB_001108bf:
  pfStack_13dc0 = (fdb_doc *)0x1108c4;
  compaction_daemon_test();
LAB_001108c4:
  pfStack_13dc0 = (fdb_doc *)0x1108c9;
  compaction_daemon_test();
LAB_001108c9:
  pfStack_13dc0 = (fdb_doc *)0x1108ce;
  compaction_daemon_test();
LAB_001108ce:
  pfStack_13dc0 = (fdb_doc *)0x1108d3;
  compaction_daemon_test();
LAB_001108d3:
  pfStack_13dc0 = (fdb_doc *)0x1108d8;
  compaction_daemon_test();
LAB_001108d8:
  pfStack_13dc0 = (fdb_doc *)0x1108dd;
  compaction_daemon_test();
LAB_001108dd:
  pfStack_13dc0 = (fdb_doc *)0x1108e2;
  compaction_daemon_test();
LAB_001108e2:
  pfStack_13dc0 = (fdb_doc *)0x1108e7;
  compaction_daemon_test();
LAB_001108e7:
  pfStack_13dc0 = (fdb_doc *)0x1108ec;
  compaction_daemon_test();
LAB_001108ec:
  pfStack_13dc0 = (fdb_doc *)0x1108f1;
  compaction_daemon_test();
LAB_001108f1:
  pfStack_13dc0 = (fdb_doc *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_13f58 = (fdb_doc *)0x110916;
  aStack_13de8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar5;
  pfStack_13de0 = unaff_R12;
  pcStack_13dd8 = unaff_R13;
  pfStack_13dd0 = pfVar9;
  pcStack_13dc8 = (char *)unaff_R15._M_i;
  pfStack_13dc0 = pfVar7;
  gettimeofday(&tStack_13f08,(__timezone_ptr_t)0x0);
  pfStack_13f58 = (fdb_doc *)0x11091b;
  memleak_start();
  pfStack_13f58 = (fdb_doc *)0x110927;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_13f58 = (fdb_doc *)0x110934;
  fdb_get_default_config();
  uStack_13eb2 = 1;
  uStack_13ea8._0_2_ = 1;
  uStack_13ea8._2_2_ = 0;
  uStack_13ea8._4_4_ = 0;
  pfStack_13f58 = (fdb_doc *)0x110955;
  fVar1 = fdb_open(&pfStack_13f48,"compact_test",(fdb_config *)(auStack_13ef8 + 0x18));
  pfVar12 = (fdb_config *)(auStack_13ef8 + 0x18);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfVar12 = (fdb_config *)auStack_13ef8;
    pfStack_13f58 = (fdb_doc *)0x11096a;
    fdb_get_default_kvs_config();
    pfStack_13f58 = (fdb_doc *)0x11097c;
    fVar1 = fdb_kvs_open_default(pfStack_13f48,&pfStack_13f40,(fdb_kvs_config *)pfVar12);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110aad;
    pfStack_13f58 = (fdb_doc *)0x110993;
    gettimeofday(&tStack_13f18,(__timezone_ptr_t)0x0);
    pfStack_13f58 = (fdb_doc *)0x1109a3;
    printf("wait for %d seconds..\n",(ulong)pcVar8 & 0xffffffff);
    tVar14.tv_usec = tStack_13f18.tv_usec;
    tVar14.tv_sec = tStack_13f18.tv_sec;
    unaff_R13 = acStack_13f27;
    pfVar7 = (fdb_doc *)0x0;
    do {
      iVar2 = (int)pfVar7;
      pfStack_13f58 = (fdb_doc *)0x1109c4;
      sprintf(unaff_R13,"%d",pfVar7);
      unaff_R12 = pfStack_13f40;
      pfStack_13f58 = (fdb_doc *)0x1109d1;
      sVar3 = strlen(unaff_R13);
      pfStack_13f58 = (fdb_doc *)0x1109ec;
      fVar1 = fdb_set_kv(unaff_R12,unaff_R13,sVar3,"value",5);
      pfVar12 = (fdb_config *)tStack_13f18.tv_sec;
      unaff_R15._M_i = tStack_13f18.tv_usec;
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00110aa3:
        pfStack_13f58 = (fdb_doc *)0x110aa8;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa8;
      }
      pfStack_13f58 = (fdb_doc *)0x110a00;
      fVar1 = fdb_commit(pfStack_13f48,'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStack_13f58 = (fdb_doc *)0x110aa3;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa3;
      }
      pfStack_13f58 = (fdb_doc *)0x110a14;
      gettimeofday((timeval *)&tStack_13f38,(__timezone_ptr_t)0x0);
      pfStack_13f58 = (fdb_doc *)0x110a29;
      tVar15 = _utime_gap(tVar14,tStack_13f38);
    } while (((fdb_kvs_handle *)tVar15.tv_sec < pcVar8) &&
            (pfVar7 = (fdb_doc *)(ulong)(iVar2 + 1), iVar2 != 99999));
    pfStack_13f58 = (fdb_doc *)0x110a49;
    fVar1 = fdb_close(pfStack_13f48);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ab2;
    pfStack_13f58 = (fdb_doc *)0x110a52;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_13f58 = (fdb_doc *)0x110a5b;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_13f58 = (fdb_doc *)0x110a8c;
      fprintf(_stderr,pcVar8,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110aa8:
    pfStack_13f58 = (fdb_doc *)0x110aad;
    auto_compaction_with_concurrent_insert_test();
LAB_00110aad:
    pfStack_13f58 = (fdb_doc *)0x110ab2;
    auto_compaction_with_concurrent_insert_test();
LAB_00110ab2:
    pfStack_13f58 = (fdb_doc *)0x110ab7;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_13f58 = (fdb_doc *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_13f80 = (fdb_kvs_handle *)pcVar8;
  pfStack_13f78 = unaff_R12;
  pcStack_13f70 = unaff_R13;
  pfStack_13f68 = pfVar12;
  pcStack_13f60 = (char *)unaff_R15._M_i;
  pfStack_13f58 = pfVar7;
  gettimeofday(&tStack_14288,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_142f8._32_8_ = (btree *)0x0;
  auStack_142f8._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_14078.wal_threshold = 0x1000;
  fStack_14078.compaction_mode = '\x01';
  fStack_14078.compaction_threshold = '\n';
  fStack_14078.compactor_sleep_duration = 1;
  info_00 = (fdb_file_info *)0x14e0c5;
  pfVar9 = (fdb_kvs_handle *)&pfStack_14318;
  kvs_config_00 = (fdb_file_info *)0x1;
  fVar1 = fdb_open_custom_cmp((fdb_file_handle **)pfVar9,"compact_test",&fStack_14078,1,
                              (char **)(auStack_142f8 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_142f8 + 0x18),(void **)0x0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_142f8._16_8_ = afStack_14278[0].doc_count;
    auStack_142f8._0_8_ = afStack_14278[0].filename;
    auStack_142f8._8_8_ = afStack_14278[0].new_filename;
    info_00 = (fdb_file_info *)auStack_14310;
    pfVar9 = pfStack_14318;
    fVar1 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_14318,(fdb_kvs_handle **)info_00,
                       (fdb_kvs_config *)auStack_142f8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110eb4;
    info_00 = (fdb_file_info *)auStack_14300;
    kvs_config_00 = (fdb_file_info *)auStack_142f8;
    pfVar9 = pfStack_14318;
    fVar1 = fdb_kvs_open((fdb_file_handle *)pfStack_14318,(fdb_kvs_handle **)info_00,"db",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110eb9;
    uVar11 = 0;
    do {
      sprintf((char *)afStack_14278,"key%06d",uVar11);
      sprintf((char *)afStack_14178,"body%06d",uVar11);
      pfVar9 = (fdb_kvs_handle *)auStack_14310._0_8_;
      sVar3 = strlen((char *)afStack_14278);
      sVar4 = strlen((char *)afStack_14178);
      kvs_config_00 = afStack_14178;
      info_00 = afStack_14278;
      fVar1 = fdb_set_kv(pfVar9,afStack_14278,sVar3,afStack_14178,sVar4);
      handle = auStack_14300;
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_00110e9b:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110ea0;
      }
      sVar3 = strlen((char *)afStack_14278);
      sVar4 = strlen((char *)afStack_14178);
      kvs_config_00 = afStack_14178;
      info_00 = afStack_14278;
      fVar1 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_14278,sVar3,afStack_14178,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar9 = (fdb_kvs_handle *)handle;
        goto LAB_00110e9b;
      }
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
    } while (uVar10 != 10000);
    kvs_config_00 = (fdb_file_info *)auStack_142f8;
    auStack_142f8._8_8_ = _compact_test_keycmp;
    info_00 = (fdb_file_info *)(auStack_14310 + 8);
    pfVar9 = pfStack_14318;
    fVar1 = fdb_kvs_open((fdb_file_handle *)pfStack_14318,(fdb_kvs_handle **)info_00,"db_custom",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ebe;
    info_00 = afStack_14278;
    sprintf((char *)info_00,"key%06d",0);
    kvs_config_00 = afStack_14178;
    sprintf((char *)kvs_config_00,"body%06d",0);
    sVar3 = strlen((char *)info_00);
    sVar4 = strlen((char *)kvs_config_00);
    fVar1 = fdb_set_kv((fdb_kvs_handle *)auStack_14310._8_8_,info_00,sVar3,kvs_config_00,sVar4);
    pfVar9 = (fdb_kvs_handle *)auStack_14310._8_8_;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ec3;
    info_00 = (fdb_file_info *)0x0;
    pfVar9 = pfStack_14318;
    fVar1 = fdb_commit((fdb_file_handle *)pfStack_14318,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ec8;
    uVar11 = 0;
    uVar13 = 0;
    do {
      sprintf((char *)afStack_14278,"key%06d",uVar13);
      sprintf((char *)afStack_14178,"body%06d",uVar13);
      pfVar9 = (fdb_kvs_handle *)auStack_14310._0_8_;
      sVar3 = strlen((char *)afStack_14278);
      sVar4 = strlen((char *)afStack_14178);
      kvs_config_00 = afStack_14178;
      info_00 = afStack_14278;
      fVar1 = fdb_set_kv(pfVar9,afStack_14278,sVar3,afStack_14178,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ea5;
      info_00 = (fdb_file_info *)(auStack_142f8 + 0x28);
      pfVar9 = pfStack_14318;
      fVar1 = fdb_get_file_info((fdb_file_handle *)pfStack_14318,info_00);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ea0;
      if (uVar11 < uStack_142a8) {
        uVar11 = uStack_142a8;
      }
      uVar10 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar10;
    } while (uVar10 != 10000);
    info_00 = (fdb_file_info *)0x0;
    pfVar9 = pfStack_14318;
    fVar1 = fdb_commit((fdb_file_handle *)pfStack_14318,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ecd;
    info_00 = (fdb_file_info *)(auStack_142f8 + 0x28);
    pfVar9 = pfStack_14318;
    fVar1 = fdb_get_file_info((fdb_file_handle *)pfStack_14318,info_00);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110ed2;
    if (uVar11 < uStack_142a8) {
      uVar11 = uStack_142a8;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar11);
    do {
      sleep(1);
      info_00 = (fdb_file_info *)(auStack_142f8 + 0x28);
      pfVar9 = pfStack_14318;
      fVar1 = fdb_get_file_info((fdb_file_handle *)pfStack_14318,
                                (fdb_file_info *)(auStack_142f8 + 0x28));
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00110eaa;
    } while (uVar11 <= uStack_142a8);
    fVar1 = fdb_close((fdb_file_handle *)pfStack_14318);
    pfVar9 = pfStack_14318;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_shutdown();
      pfVar9 = pfStack_14318;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar8 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar8 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar8,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110edc;
    }
  }
  else {
LAB_00110eaf:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb4:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb9:
    auto_compaction_with_custom_cmp_function();
LAB_00110ebe:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec3:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec8:
    auto_compaction_with_custom_cmp_function();
LAB_00110ecd:
    auto_compaction_with_custom_cmp_function();
LAB_00110ed2:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110edc:
  auto_compaction_with_custom_cmp_function();
  if (info_00 == kvs_config_00) {
    memcmp(pfVar9,__s2,(size_t)info_00);
    return;
  }
  if (info_00 < kvs_config_00) {
    kvs_config_00 = info_00;
  }
  memcmp(pfVar9,__s2,(size_t)kvs_config_00);
  return;
}

Assistant:

void compaction_daemon_test(size_t time_sec)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10000;
    int compaction_threshold = 30;
    int escape = 0;
    fdb_file_handle *dbfile, *dbfile_less, *dbfile_non, *dbfile_manual, *dbfile_new;
    fdb_kvs_handle *db, *db_less, *db_non, *db_manual;
    fdb_kvs_handle *snapshot;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_file_info info;
    fdb_status status;
    struct timeval ts_begin, ts_cur, ts_gap;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_mode = FDB_COMPACTION_AUTO;
    fconfig.compaction_threshold = compaction_threshold;
    fconfig.compactor_sleep_duration = 1; // for quick test

    fconfig.num_compactor_threads = 0;
    status = fdb_open(&dbfile, "compact_test", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_CONFIG);

    fconfig.num_compactor_threads = DEFAULT_NUM_COMPACTOR_THREADS;
    // open db
    fdb_open(&dbfile, "compact_test", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compaction_daemon_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // insert documents
    printf("Initialize..\n");
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%04d", i);
        sprintf(metabuf, "meta%04d", i);
        sprintf(bodybuf, "body%04d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf)+1,
            (void*)metabuf, strlen(metabuf)+1, (void*)bodybuf, strlen(bodybuf)+1);
        fdb_set(db, doc[i]);
    }
    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    // close db file
    fdb_close(dbfile);

    // ---- basic retrieve test ------------------------
    // reopen db file
    status = fdb_open(&dbfile, "compact_test", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compaction_daemon_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // check db filename
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(!strcmp(info.filename, "compact_test"));

    // retrieve documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%04d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf)+1,
            NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        //printf("%s %s\n", rdoc->key, rdoc->body);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // create a snapshot
    status = fdb_snapshot_open(db, &snapshot, n);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // close snapshot
    fdb_kvs_close(snapshot);

    // close db file
    fdb_close(dbfile);

    // ---- handling when metafile is removed ------------
    // remove meta file
    r = system(SHELL_DEL" compact_test.meta > errorlog.txt");
    (void)r;
    // reopen db file
    status = fdb_open(&dbfile, "compact_test", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compaction_daemon_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // retrieve documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%04d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf)+1,
            NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        //printf("%s %s\n", rdoc->key, rdoc->body);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }
    // close db file
    fdb_close(dbfile);

    // ---- handling when metafile points to non-exist file ------------
    // remove meta file
    r = system(SHELL_MOVE" compact_test.0 compact_test.23 > errorlog.txt");
    (void)r;
    // reopen db file
    status = fdb_open(&dbfile, "compact_test", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compaction_daemon_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // retrieve documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%04d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf)+1,
            NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        //printf("%s %s\n", rdoc->key, rdoc->body);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }
    // close db file
    fdb_close(dbfile);

    // ---- compaction daemon test -------------------
    // db: DB instance to be compacted
    // db_less: DB instance to be compacted but with much lower update throughput
    // db_non: DB instance not to be compacted (auto compaction with threshold = 0)
    // db_manual: DB instance not to be compacted (manual compaction)

    // open & create db_less, db_non and db_manual
    status = fdb_open(&dbfile_less, "compact_test_less", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile_less, &db_less, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fconfig.compaction_threshold = 0;
    status = fdb_open(&dbfile_non, "compact_test_non", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile_non, &db_non, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    status = fdb_open(&dbfile_manual, "compact_test_manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile_manual, &db_manual, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // reopen db file
    fconfig.compaction_threshold = 30;
    fconfig.compaction_mode = FDB_COMPACTION_AUTO;
    status = fdb_open(&dbfile, "compact_test", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compaction_daemon_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // continuously update documents
    printf("wait for %d seconds..\n", (int)time_sec);
    gettimeofday(&ts_begin, NULL);
    while (!escape) {
        for (i=0;i<n;++i){
            // update db
            fdb_set(db, doc[i]);
            fdb_commit(dbfile, FDB_COMMIT_NORMAL);

            // update db_less (1/100 throughput)
            if (i%100 == 0){
                fdb_set(db_less, doc[i]);
                fdb_commit(dbfile_less, FDB_COMMIT_NORMAL);
            }

            // update db_non
            fdb_set(db_non, doc[i]);
            fdb_commit(dbfile_non, FDB_COMMIT_NORMAL);

            // update db_manual
            fdb_set(db_manual, doc[i]);
            fdb_commit(dbfile_manual, FDB_COMMIT_NORMAL);

            gettimeofday(&ts_cur, NULL);
            ts_gap = _utime_gap(ts_begin, ts_cur);
            if ((size_t)ts_gap.tv_sec >= time_sec) {
                escape = 1;
                break;
            }
        }
    }

    // Change the compaction interval to 60 secs.
    status = fdb_set_daemon_compaction_interval(dbfile, 60);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // Change the compaction interval back to 1 sec.
    status = fdb_set_daemon_compaction_interval(dbfile, 1);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // perform manual compaction of auto-compact file
    status = fdb_compact(dbfile_non, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // perform manual compaction of manual-compact file
    status = fdb_compact(dbfile_manual, "compact_test_manual_compacted");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // open compact_test_manual_compacted using new db handle
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    status = fdb_open(&dbfile_new, "compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // try to switch compaction mode
    status = fdb_switch_compaction_mode(dbfile_manual, FDB_COMPACTION_AUTO, 30);
    TEST_CHK(status == FDB_RESULT_FILE_IS_BUSY);

    // close db_new
    status = fdb_close(dbfile_new);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // switch compaction mode of 'db_manual' from MANUAL to AUTO
    status = fdb_switch_compaction_mode(dbfile_manual, FDB_COMPACTION_AUTO, 10);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // change compaction value
    status = fdb_switch_compaction_mode(dbfile_manual, FDB_COMPACTION_AUTO, 30);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close and open with auto-compact option
    status = fdb_close(dbfile_manual);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fconfig.compaction_mode = FDB_COMPACTION_AUTO;
    status = fdb_open(&dbfile_manual, "compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // switch compaction mode of 'db_non' from AUTO to MANUAL
    status = fdb_switch_compaction_mode(dbfile_non, FDB_COMPACTION_MANUAL, 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close and open with manual-compact option
    status = fdb_close(dbfile_non);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    status = fdb_open(&dbfile_non, "compact_test_non", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Now perform one manual compaction on compact_test_non
    fdb_compact(dbfile_non, "compact_test_non.manual");

    // close all db files except compact_test_non
    fdb_close(dbfile);
    fdb_close(dbfile_less);
    fdb_close(dbfile_manual);

    // open manual compact file (compact_test_non) using auto compact mode
    fconfig.compaction_mode = FDB_COMPACTION_AUTO;
    status = fdb_open(&dbfile, "compact_test_non.manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_COMPACTION_MODE);

    // Attempt to destroy manual compact file using auto compact mode
    status = fdb_destroy("compact_test_non.manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_COMPACTION_MODE);

    // open auto copmact file (compact_test_manual_compacted) using manual compact mode
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    status = fdb_open(&dbfile, "compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_COMPACTION_MODE);

    // Attempt to destroy auto copmact file using manual compact mode
    status = fdb_destroy("compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_COMPACTION_MODE);

    // DESTROY auto copmact file with correct mode
    fconfig.compaction_mode = FDB_COMPACTION_AUTO;
    status = fdb_destroy("compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // DESTROY manual compacted file with past version open!
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    status = fdb_destroy("compact_test_non.manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_FILE_IS_BUSY);
    fdb_close(dbfile_non);

    // Simulate a database crash by doing a premature shutdown
    // Note that db_non was never closed properly
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_destroy("compact_test_non.manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Attempt to read-only auto compacted and destroyed file
    fconfig.flags = FDB_OPEN_FLAG_RDONLY;
    status = fdb_open(&dbfile, "./compact_test_manual_compacted", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    status = fdb_open(&dbfile, "./compact_test_manual_compacted.meta", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    // Attempt to read-only past version of manually compacted destroyed file
    status = fdb_open(&dbfile, "compact_test_non", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    // Attempt to read-only current version of manually compacted destroyed file
    status = fdb_open(&dbfile, "compact_test_non.manual", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compaction daemon test");
}